

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LogErrorCase::expectMessage
          (LogErrorCase *this,GLenum source,GLenum type)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_01;
  int numMsg;
  MessageData lastMsg;
  int msgLen;
  int local_1ec;
  MessageData local_1e8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1ec = 0;
  pTVar1 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_1e8.message._M_dataplus._M_p = (pointer)&local_1e8.message.field_2;
  local_1e8.id.source = 0;
  local_1e8.id.type = 0;
  local_1e8.id.id = 0;
  local_1e8.severity = 0;
  local_1e8.message._M_string_length = 0;
  local_1e8.message.field_2._M_local_buf[0] = '\0';
  if (type != 0x1100 && source != 0x1100) {
    (**(code **)(lVar4 + 0x868))(0x9145,&local_1ec);
    if (local_1ec != 0) {
      if (1 < local_1ec) {
        (**(code **)(lVar4 + 0x7e0))(local_1ec + -1,0,0,0,0,0,0,0);
      }
      local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
      (**(code **)(lVar4 + 0x868))(0x8243,local_1b0);
      if ((int)local_1b0._0_4_ < 0) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Negative message length","msgLen >= 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x316);
      }
      else {
        if ((int)local_1b0._0_4_ < 100000) {
          std::__cxx11::string::resize((ulong)&local_1e8.message,(char)local_1b0._0_8_);
          (**(code **)(lVar4 + 0x7e0))
                    (1,local_1b0._0_8_ & 0xffffffff,&local_1e8,&local_1e8.id.type,&local_1e8.id.id,
                     &local_1e8.severity,local_1b0,local_1e8.message._M_dataplus._M_p);
          this_00 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = pTVar1;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Driver says: \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_1e8.message._M_dataplus._M_p,
                     local_1e8.message._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\"",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_138);
          BaseCase::verifyMessage(&this->super_BaseCase,&local_1e8,source,type);
          iVar2 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
          goto LAB_013caef5;
        }
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Excessively long message","msgLen < 100000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x317);
      }
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar3 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[2])();
    local_1b0._0_8_ = local_1a0;
    if ((uVar3 >> 0xb & 1) == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Verification accuracy is lacking without a debug context","");
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,
                 (string *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "A message was expected but none was reported (empty message log). Running without a debug context"
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Error was not reported as expected","");
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "A message was expected but none was reported (empty message log)",0x40);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
LAB_013caef5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.message._M_dataplus._M_p != &local_1e8.message.field_2) {
    operator_delete(local_1e8.message._M_dataplus._M_p,
                    CONCAT71(local_1e8.message.field_2._M_allocated_capacity._1_7_,
                             local_1e8.message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void LogErrorCase::expectMessage (GLenum source, GLenum type)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	int						numMsg		= 0;
	TestLog&				log			= m_testCtx.getLog();
	MessageData				lastMsg;

	if (source == GL_DONT_CARE || type == GL_DONT_CARE)
		return;

	gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMsg);

	if (numMsg == 0)
	{
		if (isDebugContext())
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Error was not reported as expected");
			log << TestLog::Message << "A message was expected but none was reported (empty message log)" << TestLog::EndMessage;
		}
		else
		{
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
			log << TestLog::Message << "A message was expected but none was reported (empty message log). Running without a debug context" << TestLog::EndMessage;
		}
		return;
	}

	// There may be messages other than the error we are looking for in the log.
	// Strictly nothing prevents the implementation from producing more than the
	// required error from an API call with a defined error. however we assume that
	// since calls that produce an error should not change GL state the implementation
	// should have nothing else to report.
	if (numMsg > 1)
		gl.getDebugMessageLog(numMsg-1, 0, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL); // Clear all but last

	{
		int  msgLen = 0;
		gl.getIntegerv(GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH, &msgLen);

		TCU_CHECK_MSG(msgLen >= 0, "Negative message length");
		TCU_CHECK_MSG(msgLen < 100000, "Excessively long message");

		lastMsg.message.resize(msgLen);
		gl.getDebugMessageLog(1, msgLen, &lastMsg.id.source, &lastMsg.id.type, &lastMsg.id.id, &lastMsg.severity, &msgLen, &lastMsg.message[0]);
	}

	log << TestLog::Message << "Driver says: \"" << lastMsg.message << "\"" << TestLog::EndMessage;

	verifyMessage(lastMsg, source, type);

	// Reset error so that code afterwards (such as glu::ShaderProgram) doesn't break because of
	// lingering error state.
	m_context.getRenderContext().getFunctions().getError();
}